

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::evaluateFunction
          (QMakeEvaluator *this,ProFunctionDef *func,QList<ProStringList> *argumentsList,
          ProStringList *ret)

{
  QArrayDataPointer<char16_t> *this_00;
  ProStringList *pPVar1;
  _List_node_base *p_Var2;
  VisitReturn VVar3;
  storage_type *psVar4;
  QArrayDataPointer<ProString> *pQVar5;
  long lVar6;
  char16_t *pcVar7;
  VisitReturn VVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  value_type vVar10;
  QByteArrayView QVar11;
  undefined1 local_c0 [32];
  QArrayDataPointer<ProString> local_a0;
  ProString local_88;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node._M_size < 100) {
    local_88.m_string.d.d = (Data *)0x0;
    std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
    push_back(&(this->m_valuemapStack).
               super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              ,(value_type *)&local_88);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                *)&local_88);
    QList<QMakeEvaluator::Location>::emplaceBack<QMakeEvaluator::Location_const&>
              (&(this->m_locationStack).super_QList<QMakeEvaluator::Location>,&this->m_current);
    local_58.d = (Data *)0x0;
    local_58.ptr = (ProString *)0x0;
    local_58.size = 0;
    lVar6 = 0;
    uVar9 = 0;
    while (uVar9 < (ulong)(argumentsList->d).size) {
      QList<ProString>::append
                ((QList<ProString> *)&local_58,
                 (QList<ProString> *)
                 ((long)&(((argumentsList->d).ptr)->super_QList<ProString>).d.d + lVar6));
      pPVar1 = (argumentsList->d).ptr;
      p_Var2 = (this->m_valuemapStack).
               super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
               .
               super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
      uVar9 = uVar9 + 1;
      QString::number((int)&local_a0,(int)uVar9);
      ProKey::ProKey((ProKey *)&local_88,(QString *)&local_a0);
      pQVar5 = (QArrayDataPointer<ProString> *)
               QMap<ProKey,_ProStringList>::operator[]
                         ((QMap<ProKey,_ProStringList> *)(p_Var2 + 1),(ProKey *)&local_88);
      QArrayDataPointer<ProString>::operator=
                (pQVar5,(QArrayDataPointer<ProString> *)
                        ((long)&(pPVar1->super_QList<ProString>).d.d + lVar6));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      lVar6 = lVar6 + 0x18;
    }
    pQVar5 = (QArrayDataPointer<ProString> *)
             QMap<ProKey,_ProStringList>::operator[]
                       ((QMap<ProKey,_ProStringList> *)
                        ((this->m_valuemapStack).
                         super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                         .
                         super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 1),
                        (ProKey *)(QMakeInternal::statics + 0x78));
    QArrayDataPointer<ProString>::operator=(pQVar5,&local_58);
    this_00 = (QArrayDataPointer<char16_t> *)(local_c0 + 8);
    QString::number((longlong)this_00,(int)(argumentsList->d).size);
    ProString::ProString(&local_88,(QString *)this_00);
    ProStringList::ProStringList((ProStringList *)&local_a0,&local_88);
    pQVar5 = (QArrayDataPointer<ProString> *)
             QMap<ProKey,_ProStringList>::operator[]
                       ((QMap<ProKey,_ProStringList> *)
                        ((this->m_valuemapStack).
                         super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                         .
                         super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 1),
                        (ProKey *)(QMakeInternal::statics + 0xa8));
    QArrayDataPointer<ProString>::operator=(pQVar5,&local_a0);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    pcVar7 = (func->m_pro->m_proitems).d.ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    VVar3 = visitProBlock(this,func->m_pro,(ushort *)(pcVar7 + func->m_offset));
    VVar8 = ReturnTrue;
    if (VVar3 != ReturnReturn) {
      VVar8 = VVar3;
    }
    if (VVar8 == ReturnTrue) {
      QArrayDataPointer<ProString>::operator=
                ((QArrayDataPointer<ProString> *)ret,
                 (QArrayDataPointer<ProString> *)&this->m_returnValue);
    }
    QList<ProString>::clear(&(this->m_returnValue).super_QList<ProString>);
    vVar10 = QList<QMakeEvaluator::Location>::takeLast
                       (&(this->m_locationStack).super_QList<QMakeEvaluator::Location>);
    (this->m_current).pro = vVar10.pro;
    (this->m_current).line = vVar10.line;
    ProValueMapStack::pop((ProValueMapStack *)local_c0);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                *)local_c0);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  else {
    psVar4 = (storage_type *)
             QByteArrayView::lengthHelperCharArray
                       ("Ran into infinite recursion (depth > 100).",0x2b);
    QVar11.m_data = psVar4;
    QVar11.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar11);
    evalError(this,&local_88.m_string);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    VVar8 = ReturnError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar8;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFunction(
        const ProFunctionDef &func, const QList<ProStringList> &argumentsList, ProStringList *ret)
{
    VisitReturn vr;

    if (m_valuemapStack.size() >= 100) {
        evalError(fL1S("Ran into infinite recursion (depth > 100)."));
        vr = ReturnError;
    } else {
        m_valuemapStack.push(ProValueMap());
        m_locationStack.push(m_current);

        ProStringList args;
        for (int i = 0; i < argumentsList.size(); ++i) {
            args += argumentsList[i];
            m_valuemapStack.top()[ProKey(QString::number(i+1))] = argumentsList[i];
        }
        m_valuemapStack.top()[statics.strARGS] = args;
        m_valuemapStack.top()[statics.strARGC] = ProStringList(ProString(QString::number(argumentsList.size())));
        vr = visitProBlock(func.pro(), func.tokPtr());
        if (vr == ReturnReturn)
            vr = ReturnTrue;
        if (vr == ReturnTrue)
            *ret = m_returnValue;
        m_returnValue.clear();

        m_current = m_locationStack.pop();
        m_valuemapStack.pop();
    }
    return vr;
}